

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int attlist2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  long lVar4;
  
  if (tok == 0xf) {
    return 0x21;
  }
  if (tok == 0x17) {
    pcVar2 = attlist3;
LAB_00347fd8:
    iVar3 = 0x21;
    state->handler = pcVar2;
  }
  else {
    if (tok == 0x12) {
      iVar3 = 0x17;
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
        iVar1 = (*enc->nameMatchesAscii)
                          (enc,ptr,end,
                           (char *)((long)&attlist2_types_rel +
                                   (long)*(int *)((long)&attlist2_types_rel + lVar4)));
        if (iVar1 != 0) {
          state->handler = attlist8;
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
      iVar3 = (*enc->nameMatchesAscii)(enc,ptr,end,"NOTATION");
      if (iVar3 != 0) {
        pcVar2 = attlist5;
        goto LAB_00347fd8;
      }
    }
    state->handler = error;
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int PTRCALL
attlist2(PROLOG_STATE *state,
         int tok,
         const char *ptr,
         const char *end,
         const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
    {
      static const char * const types[] = {
        KW_CDATA,
        KW_ID,
        KW_IDREF,
        KW_IDREFS,
        KW_ENTITY,
        KW_ENTITIES,
        KW_NMTOKEN,
        KW_NMTOKENS,
      };
      int i;
      for (i = 0; i < (int)(sizeof(types)/sizeof(types[0])); i++)
        if (XmlNameMatchesAscii(enc, ptr, end, types[i])) {
          state->handler = attlist8;
          return XML_ROLE_ATTRIBUTE_TYPE_CDATA + i;
        }
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NOTATION)) {
      state->handler = attlist5;
      return XML_ROLE_ATTLIST_NONE;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = attlist3;
    return XML_ROLE_ATTLIST_NONE;
  }
  return common(state, tok);
}